

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexCompileTime.cpp
# Opt level: O2

void __thiscall
UnifiedRegex::MatchCharNode::Emit(MatchCharNode *this,Compiler *compiler,CharCount *skipped)

{
  if (*skipped != 0) {
    *skipped = *skipped - 1;
    return;
  }
  Emit(compiler,this->cs,this->isEquivClass);
  return;
}

Assistant:

void MatchCharNode::Emit(Compiler& compiler, CharCount& skipped)
    {
        if (skipped >= 1)
        {
            // Asking to skip entire char
            skipped--;
            return;
        }

        //
        // Compilation scheme:
        //
        //   MatchChar(2|3|4)?
        //

        skipped -= min(skipped, static_cast<CharCount>(1));

        Emit(compiler, cs, isEquivClass);
    }